

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O3

vec8 * asn1::mkINT(vec8 *__return_storage_ptr__,uint64_t val)

{
  pointer *ppuVar1;
  iterator __position;
  pointer puVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uchar auStack_24 [3];
  uint8_t temp [8];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pushHead(__return_storage_ptr__,'\x02',0);
  if (val == 0) {
    temp[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,temp);
  }
  else {
    lVar4 = 0;
    do {
      lVar3 = lVar4;
      auStack_24[lVar3 + 2] = (uchar)val;
      lVar4 = lVar3 + -1;
      bVar5 = 0xff < val;
      val = val >> 8;
    } while (bVar5);
    if (lVar3 + 8 < 9) {
      do {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     __position,temp + lVar4);
        }
        else {
          *__position._M_current = temp[lVar4];
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
    }
  }
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2[1] = ((char)*(undefined4 *)
                      &(__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (char)puVar2) + 0xfe;
  return __return_storage_ptr__;
}

Assistant:

vec8 mkINT(uint64_t val)
{
    vec8 out;
    uint8_t temp[8];
    pushHead(out, 0x2, 0);
    if (val == 0) {
        out.push_back(0);
    } else {
        int i = 8;
        while (val) {
            temp[--i] = (val & 0xff);
            val >>= 8;
        }
        for (; i < 8; i++)
            out.push_back(temp[i]);
    }

    out[1] = (uint8_t)out.size() - 2;

    return out;
}